

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9150::setSampleRate(RTIMUMPU9150 *this)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = 1000;
  if (this->m_lpf == '\0') {
    lVar2 = 8000;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                             '\x19',(char)(lVar2 / (long)(this->super_RTIMU).m_sampleRate) + 0xff,
                             "Failed to set sample rate");
  return bVar1;
}

Assistant:

bool RTIMUMPU9150::setSampleRate()
{
    int clockRate = 1000;

    if (m_lpf == MPU9150_LPF_256)
        clockRate = 8000;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_SMPRT_DIV, (unsigned char)(clockRate / m_sampleRate - 1),
                  "Failed to set sample rate"))
        return false;

    return true;
}